

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Value * parse_object_value(char **string,size_t nesting)

{
  size_t sVar1;
  ushort **ppuVar2;
  size_t sVar3;
  size_t local_50;
  size_t key_len;
  char *new_key;
  JSON_Object *output_object;
  JSON_Value *new_value;
  JSON_Value *output_value;
  size_t sStack_20;
  JSON_Status status;
  size_t nesting_local;
  char **string_local;
  
  output_value._4_4_ = 0xffffffff;
  new_value = (JSON_Value *)0x0;
  output_object = (JSON_Object *)0x0;
  new_key = (char *)0x0;
  key_len = 0;
  sStack_20 = nesting;
  nesting_local = (size_t)string;
  new_value = json_value_init_object();
  if (new_value == (JSON_Value *)0x0) {
    string_local = (char **)0x0;
  }
  else if (**(char **)nesting_local == '{') {
    new_key = (char *)json_value_get_object(new_value);
    *(long *)nesting_local = *(long *)nesting_local + 1;
    while (ppuVar2 = __ctype_b_loc(),
          ((*ppuVar2)[(int)(uint)**(byte **)nesting_local] & 0x2000) != 0) {
      *(long *)nesting_local = *(long *)nesting_local + 1;
    }
    if (**(char **)nesting_local == '}') {
      *(long *)nesting_local = *(long *)nesting_local + 1;
      string_local = (char **)new_value;
    }
    else {
      do {
        if (**(char **)nesting_local == '\0') break;
        local_50 = 0;
        key_len = (size_t)get_quoted_string((char **)nesting_local,&local_50);
        sVar1 = local_50;
        if ((char *)key_len == (char *)0x0) {
          json_value_free(new_value);
          return (JSON_Value *)0x0;
        }
        sVar3 = strlen((char *)key_len);
        if (sVar1 != sVar3) {
          (*parson_free)((void *)key_len);
          json_value_free(new_value);
          return (JSON_Value *)0x0;
        }
        while (ppuVar2 = __ctype_b_loc(),
              ((*ppuVar2)[(int)(uint)**(byte **)nesting_local] & 0x2000) != 0) {
          *(long *)nesting_local = *(long *)nesting_local + 1;
        }
        if (**(char **)nesting_local != ':') {
          (*parson_free)((void *)key_len);
          json_value_free(new_value);
          return (JSON_Value *)0x0;
        }
        *(long *)nesting_local = *(long *)nesting_local + 1;
        output_object = (JSON_Object *)parse_value((char **)nesting_local,sStack_20);
        if (output_object == (JSON_Object *)0x0) {
          (*parson_free)((void *)key_len);
          json_value_free(new_value);
          return (JSON_Value *)0x0;
        }
        output_value._4_4_ =
             json_object_add((JSON_Object *)new_key,(char *)key_len,(JSON_Value *)output_object);
        if (output_value._4_4_ != 0) {
          (*parson_free)((void *)key_len);
          json_value_free((JSON_Value *)output_object);
          json_value_free(new_value);
          return (JSON_Value *)0x0;
        }
        output_value._4_4_ = 0;
        while (ppuVar2 = __ctype_b_loc(),
              ((*ppuVar2)[(int)(uint)**(byte **)nesting_local] & 0x2000) != 0) {
          *(long *)nesting_local = *(long *)nesting_local + 1;
        }
        if (**(char **)nesting_local != ',') break;
        *(long *)nesting_local = *(long *)nesting_local + 1;
        while (ppuVar2 = __ctype_b_loc(),
              ((*ppuVar2)[(int)(uint)**(byte **)nesting_local] & 0x2000) != 0) {
          *(long *)nesting_local = *(long *)nesting_local + 1;
        }
      } while (**(char **)nesting_local != '}');
      while (ppuVar2 = __ctype_b_loc(),
            ((*ppuVar2)[(int)(uint)**(byte **)nesting_local] & 0x2000) != 0) {
        *(long *)nesting_local = *(long *)nesting_local + 1;
      }
      if (**(char **)nesting_local == '}') {
        *(long *)nesting_local = *(long *)nesting_local + 1;
        string_local = (char **)new_value;
      }
      else {
        json_value_free(new_value);
        string_local = (char **)0x0;
      }
    }
  }
  else {
    json_value_free(new_value);
    string_local = (char **)0x0;
  }
  return (JSON_Value *)string_local;
}

Assistant:

static JSON_Value * parse_object_value(const char **string, size_t nesting) {
    JSON_Status status = JSONFailure;
    JSON_Value *output_value = NULL, *new_value = NULL;
    JSON_Object *output_object = NULL;
    char *new_key = NULL;

    output_value = json_value_init_object();
    if (output_value == NULL) {
        return NULL;
    }
    if (**string != '{') {
        json_value_free(output_value);
        return NULL;
    }
    output_object = json_value_get_object(output_value);
    SKIP_CHAR(string);
    SKIP_WHITESPACES(string);
    if (**string == '}') { /* empty object */
        SKIP_CHAR(string);
        return output_value;
    }
    while (**string != '\0') {
        size_t key_len = 0;
        new_key = get_quoted_string(string, &key_len);
        /* We do not support key names with embedded \0 chars */
        if (!new_key) {
            json_value_free(output_value);
            return NULL;
        }
        if (key_len != strlen(new_key)) {
            parson_free(new_key);
            json_value_free(output_value);
            return NULL;
        }
        SKIP_WHITESPACES(string);
        if (**string != ':') {
            parson_free(new_key);
            json_value_free(output_value);
            return NULL;
        }
        SKIP_CHAR(string);
        new_value = parse_value(string, nesting);
        if (new_value == NULL) {
            parson_free(new_key);
            json_value_free(output_value);
            return NULL;
        }
        status = json_object_add(output_object, new_key, new_value);
        if (status != JSONSuccess) {
            parson_free(new_key);
            json_value_free(new_value);
            json_value_free(output_value);
            return NULL;
        }
        SKIP_WHITESPACES(string);
        if (**string != ',') {
            break;
        }
        SKIP_CHAR(string);
        SKIP_WHITESPACES(string);
        if (**string == '}') {
            break;
        }
    }
    SKIP_WHITESPACES(string);
    if (**string != '}') {
        json_value_free(output_value);
        return NULL;
    }
    SKIP_CHAR(string);
    return output_value;
}